

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefParamSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DefParamSyntax,slang::syntax::DefParamSyntax_const&>
          (BumpAllocator *this,DefParamSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  DefParamSyntax *pDVar8;
  
  pDVar8 = (DefParamSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefParamSyntax *)this->endPtr < pDVar8 + 1) {
    pDVar8 = (DefParamSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pDVar8 + 1);
  }
  (pDVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pDVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pDVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623138;
  uVar5 = (args->defparam).field_0x2;
  NVar6.raw = (args->defparam).numFlags.raw;
  uVar7 = (args->defparam).rawLen;
  pIVar3 = (args->defparam).info;
  (pDVar8->defparam).kind = (args->defparam).kind;
  (pDVar8->defparam).field_0x2 = uVar5;
  (pDVar8->defparam).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar8->defparam).rawLen = uVar7;
  (pDVar8->defparam).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->assignments).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->assignments).super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar8->assignments).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->assignments).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar8->assignments).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pDVar8->assignments).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar8->assignments).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->assignments).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pDVar8->assignments).super_SyntaxListBase.childCount =
       (args->assignments).super_SyntaxListBase.childCount;
  (pDVar8->assignments).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623b80;
  sVar2 = (args->assignments).elements._M_extent._M_extent_value;
  (pDVar8->assignments).elements._M_ptr = (args->assignments).elements._M_ptr;
  (pDVar8->assignments).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pDVar8->semi).kind = (args->semi).kind;
  (pDVar8->semi).field_0x2 = uVar5;
  (pDVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar8->semi).rawLen = uVar7;
  (pDVar8->semi).info = pIVar3;
  return pDVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }